

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O3

void api_suite::api_find(void)

{
  key_type local_7c;
  iterator local_78;
  map_array<int,_int,_4UL,_std::less<int>_> *local_70;
  map_array<int,_int,_4UL,_std::less<int>_> local_68;
  
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail =
       local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems + 1;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[1].second = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[2].second = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].first = 0;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[3].second = 0;
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.tail = (pointer)&local_68.super_map_view<int,_int,_4UL,_std::less<int>_>;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].first = 0xb;
  local_68.super_array<vista::pair<int,_int>,_4UL>._M_elems[0].second = 1;
  local_7c = 10;
  local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.super_span<vista::pair<int,_int>,_4UL>.
  member.head = (pointer)&local_68;
  local_78 = vista::map_array<int,_int,_4UL,_std::less<int>_>::find(&local_68,&local_7c);
  local_70 = (map_array<int,_int,_4UL,_std::less<int>_> *)
             local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.find(10)","array.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x84,"void api_suite::api_find()",&local_78,&local_70);
  local_7c = 0xb;
  local_78 = vista::map_array<int,_int,_4UL,_std::less<int>_>::find(&local_68,&local_7c);
  local_70 = (map_array<int,_int,_4UL,_std::less<int>_> *)
             local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.
             super_span<vista::pair<int,_int>,_4UL>.member.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.find(11)","array.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x85,"void api_suite::api_find()",&local_78,&local_70);
  local_7c = 0xc;
  local_78 = vista::map_array<int,_int,_4UL,_std::less<int>_>::find(&local_68,&local_7c);
  local_70 = (map_array<int,_int,_4UL,_std::less<int>_> *)
             local_68.super_map_view<int,_int,_4UL,_std::less<int>_>.member.tail;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("array.find(12)","array.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_array_suite.cpp"
             ,0x86,"void api_suite::api_find()",&local_78,&local_70);
  return;
}

Assistant:

void api_ctor_default()
{
    map_array<int, int, 4> array;
    BOOST_TEST_EQ(array.size(), 0);
    BOOST_TEST_EQ(array.capacity(), 4);
}